

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void sequential_row(standard_display *dp,png_structp pp,png_infop pi,int iImage,int iDisplay)

{
  byte bVar1;
  uint uVar2;
  png_store *ps;
  png_uint_32 pVar3;
  uint pass;
  uint uVar4;
  png_bytep ppVar5;
  png_bytep ppVar6;
  byte bVar7;
  uint uVar8;
  uint y;
  bool bVar9;
  png_byte display [1024];
  png_byte row [1024];
  png_byte local_838 [1024];
  png_byte local_438 [1032];
  
  if (dp->do_interlace == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = dp->interlace_type == '\x01';
  }
  uVar2 = dp->npasses;
  uVar8 = dp->id;
  if (uVar8 < 0x1000000) {
    pVar3 = transform_height(pp,(byte)uVar8 & 7,(byte)uVar8 >> 3);
  }
  else {
    pVar3 = uVar8 >> 0x18;
  }
  bVar1 = *(byte *)((long)&dp->id + 2);
  uVar8 = 0x80;
  if (bVar1 != 0) {
    uVar8 = (uint)bVar1;
  }
  if (0 < (int)uVar2) {
    ps = dp->ps;
    pass = 0;
    do {
      uVar4 = pass + 1;
      if (pVar3 != 0) {
        bVar1 = (byte)(7 - pass >> 1);
        if (pass < 2) {
          bVar1 = 3;
        }
        bVar7 = (char)(7 - pass) * '\x04';
        y = 0;
        do {
          if (bVar9) {
            if (((~(-1 << (bVar1 & 0x1f)) + uVar8) -
                 ((pass & 1) << (3U - (char)(uVar4 >> 1) & 0x1f) & 7) >> (bVar1 & 0x1f) != 0) &&
               (((0x1145af0U >> (bVar7 & 0x1f) & 0xf0 | 0x110145afU >> (bVar7 & 0x1f) & 0xf) >>
                 (y & 7) & 1) != 0)) {
              memset(local_438,0xc5,0x400);
              memset(local_838,0x5c,0x400);
              png_read_row(pp,local_438,local_838);
              if (-1 < iImage) {
                ppVar5 = store_image_row(ps,pp,0,y);
                deinterlace_row(ppVar5,local_438,dp->pixel_size,dp->w,pass,dp->littleendian);
              }
              ppVar5 = store_image_row(ps,pp,iDisplay,y);
              deinterlace_row(ppVar5,local_838,dp->pixel_size,dp->w,pass,dp->littleendian);
            }
          }
          else {
            if (iImage < 0) {
              ppVar5 = (png_bytep)0x0;
            }
            else {
              ppVar5 = store_image_row(ps,pp,0,y);
            }
            ppVar6 = store_image_row(ps,pp,iDisplay,y);
            png_read_row(pp,ppVar5,ppVar6);
          }
          y = y + 1;
        } while (pVar3 != y);
      }
      pass = uVar4;
    } while (uVar4 != uVar2);
  }
  png_read_end(pp,pi);
  return;
}

Assistant:

static void
sequential_row(standard_display *dp, png_structp pp, png_infop pi,
    int iImage, int iDisplay)
{
   int npasses = dp->npasses;
   int do_interlace = dp->do_interlace &&
      dp->interlace_type == PNG_INTERLACE_ADAM7;
   png_uint_32 height = standard_height(pp, dp->id);
   png_uint_32 width = standard_width(pp, dp->id);
   const png_store* ps = dp->ps;
   int pass;

   for (pass=0; pass<npasses; ++pass)
   {
      png_uint_32 y;
      png_uint_32 wPass = PNG_PASS_COLS(width, pass);

      for (y=0; y<height; ++y)
      {
         if (do_interlace)
         {
            /* wPass may be zero or this row may not be in this pass.
             * png_read_row must not be called in either case.
             */
            if (wPass > 0 && PNG_ROW_IN_INTERLACE_PASS(y, pass))
            {
               /* Read the row into a pair of temporary buffers, then do the
                * merge here into the output rows.
                */
               png_byte row[STANDARD_ROWMAX], display[STANDARD_ROWMAX];

               /* The following aids (to some extent) error detection - we can
                * see where png_read_row wrote.  Use opposite values in row and
                * display to make this easier.  Don't use 0xff (which is used in
                * the image write code to fill unused bits) or 0 (which is a
                * likely value to overwrite unused bits with).
                */
               memset(row, 0xc5, sizeof row);
               memset(display, 0x5c, sizeof display);

               png_read_row(pp, row, display);

               if (iImage >= 0)
                  deinterlace_row(store_image_row(ps, pp, iImage, y), row,
                     dp->pixel_size, dp->w, pass, dp->littleendian);

               if (iDisplay >= 0)
                  deinterlace_row(store_image_row(ps, pp, iDisplay, y), display,
                     dp->pixel_size, dp->w, pass, dp->littleendian);
            }
         }
         else
            png_read_row(pp,
               iImage >= 0 ? store_image_row(ps, pp, iImage, y) : NULL,
               iDisplay >= 0 ? store_image_row(ps, pp, iDisplay, y) : NULL);
      }
   }

   /* And finish the read operation (only really necessary if the caller wants
    * to find additional data in png_info from chunks after the last IDAT.)
    */
   png_read_end(pp, pi);
}